

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::find
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *__a;
  int *piVar4;
  int *in_RDX;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RSI;
  data_node_type *in_RDI;
  double dVar5;
  double dVar6;
  int idx;
  data_node_type *leaf;
  double tolerance;
  int bucketID_prediction_rounded;
  data_node_type *leaf_1;
  int bucketID;
  double bucketID_prediction;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  data_node_type *this_00;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_01;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int local_54 [4];
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_8;
  
  in_RSI->contraction_threshold_ = (double)((long)in_RSI->contraction_threshold_ + 1);
  iVar3 = *in_RDX;
  local_8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)(in_RSI->super_AlexNode<int,_int>)._vptr_AlexNode;
  this_00 = in_RDI;
  this_01 = in_RSI;
  if (((local_8->super_AlexNode<int,_int>).is_leaf_ & 1U) == 0) {
    do {
      register0x00001200 =
           LinearModel<int>::predict_double(&(local_8->super_AlexNode<int,_int>).model_,iVar3);
      local_54[2] = (int)register0x00001200;
      local_54[1] = 0;
      __a = std::max<int>(local_54 + 2,local_54 + 1);
      local_54[0] = *(int *)&local_8->allocator_ + -1;
      piVar4 = std::min<int>(__a,local_54);
      iVar2 = (int)__a;
      local_54[2] = *piVar4;
      local_8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(local_8->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_54[2]];
    } while (((local_8->super_AlexNode<int,_int>).is_leaf_ & 1U) == 0);
    in_RSI->expansion_threshold_ =
         (double)((long)(local_8->super_AlexNode<int,_int>).level_ +
                 (long)in_RSI->expansion_threshold_);
    dVar1 = stack0xffffffffffffffb8 + 0.5;
    dVar5 = std::numeric_limits<double>::epsilon();
    dVar5 = dVar5 * 10.0 * stack0xffffffffffffffb8;
    dVar6 = stack0xffffffffffffffb8 - (double)(int)dVar1;
    std::abs(iVar2);
    if (dVar6 <= dVar5) {
      if (stack0xffffffffffffffb8 < (double)(int)dVar1) {
        if ((local_8->next_leaf_ != (self_type *)0x0) &&
           (iVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    ::first_key(this_01), iVar2 <= iVar3)) {
          local_8 = local_8->next_leaf_;
        }
      }
      else if ((local_8->prev_leaf_ != (self_type *)0x0) &&
              (iVar2 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       ::last_key(this_01), iVar3 <= iVar2)) {
        local_8 = local_8->prev_leaf_;
      }
    }
  }
  iVar3 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          find_key(local_8,(int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (iVar3 < 0) {
    end((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)this_01);
  }
  else {
    Iterator::Iterator((Iterator *)this_00,in_RDI,0);
  }
  return (Iterator *)this_00;
}

Assistant:

typename self_type::Iterator find(const T& key) {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_key(key);
    if (idx < 0) {
      return end();
    } else {
      return Iterator(leaf, idx);
    }
  }